

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseExpressionM(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FxBinaryLogical *this;
  FxExpression *pFVar2;
  FxExpression *pFVar3;
  FxConditional *this_00;
  FxAssign *pFVar4;
  FxAssignSelf *this_01;
  int iVar5;
  FxBinaryLogical *l;
  FScriptPosition local_40;
  
  this = (FxBinaryLogical *)ParseExpressionK(sc,cls);
  bVar1 = FScanner::CheckToken(sc,0x11c);
  l = this;
  if (bVar1) {
    do {
      pFVar2 = ParseExpressionK(sc,cls);
      this = (FxBinaryLogical *)FMemArena::Alloc(&FxAlloc,0x50);
      FxBinaryLogical::FxBinaryLogical(this,0x11c,&l->super_FxExpression,pFVar2);
      bVar1 = FScanner::CheckToken(sc,0x11c);
      l = this;
    } while (bVar1);
  }
  bVar1 = FScanner::CheckToken(sc,0x3f);
  if (bVar1) {
    pFVar2 = ParseExpressionM(sc,cls);
    FScanner::MustGetToken(sc,0x3a);
    pFVar3 = ParseExpressionM(sc,cls);
    this_00 = (FxConditional *)FMemArena::Alloc(&FxAlloc,0x40);
    FxConditional::FxConditional(this_00,&this->super_FxExpression,pFVar2,pFVar3);
    return &this_00->super_FxExpression;
  }
  bVar1 = FScanner::CheckToken(sc,0x3d);
  if (bVar1) {
    pFVar2 = ParseExpressionM(sc,cls);
    pFVar4 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x48);
    FxAssign::FxAssign(pFVar4,&this->super_FxExpression,pFVar2,false);
    return &pFVar4->super_FxExpression;
  }
  this_01 = (FxAssignSelf *)FMemArena::Alloc(&FxAlloc,0x30);
  FScriptPosition::FScriptPosition(&local_40,sc);
  FxAssignSelf::FxAssignSelf(this_01,&local_40);
  FString::~FString(&local_40.FileName);
  FScanner::GetToken(sc);
  switch(sc->TokenType) {
  case 0x10b:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x116;
    break;
  case 0x10c:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x117;
    break;
  case 0x10d:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x118;
    break;
  case 0x10e:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x2b;
    goto LAB_00540a6a;
  case 0x10f:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x2d;
LAB_00540a6a:
    FxAddSub::FxAddSub((FxAddSub *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_00540b4c;
  case 0x110:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x2a;
    goto LAB_00540afc;
  case 0x111:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x2f;
    goto LAB_00540afc;
  case 0x112:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x25;
LAB_00540afc:
    FxMulDiv::FxMulDiv((FxMulDiv *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_00540b4c;
  case 0x113:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x26;
    goto LAB_00540b42;
  case 0x114:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x5e;
    goto LAB_00540b42;
  case 0x115:
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
    iVar5 = 0x7c;
LAB_00540b42:
    FxBitOp::FxBitOp((FxBitOp *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_00540b4c;
  default:
    FScanner::UnGet(sc);
    (*(this_01->super_FxExpression)._vptr_FxExpression[1])(this_01);
    return &this->super_FxExpression;
  }
  FxShift::FxShift((FxShift *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
LAB_00540b4c:
  pFVar3 = ParseExpressionM(sc,cls);
  *(FxExpression **)&pFVar2[1].ScriptPosition.ScriptLine = pFVar3;
  pFVar4 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x48);
  FxAssign::FxAssign(pFVar4,&this->super_FxExpression,pFVar2,true);
  this_01->Assignment = pFVar4;
  return &pFVar4->super_FxExpression;
}

Assistant:

static FxExpression *ParseExpressionM (FScanner &sc, PClassActor *cls)
{
	FxExpression *base = ParseExpressionL (sc, cls);

	if (sc.CheckToken('?'))
	{
		FxExpression *truex = ParseExpressionM (sc, cls);
		sc.MustGetToken(':');
		FxExpression *falsex = ParseExpressionM (sc, cls);
		return new FxConditional(base, truex, falsex);
	}
	else if (sc.CheckToken('='))
	{
		FxExpression *right = ParseExpressionM(sc, cls);
		return new FxAssign(base, right);
	}
	else
	{
		FxBinary *exp;
		FxAssignSelf *left = new FxAssignSelf(sc);

		sc.GetToken();
		switch (sc.TokenType)
		{
		case TK_AddEq:
			exp = new FxAddSub('+', left, nullptr);
			break;

		case TK_SubEq:
			exp = new FxAddSub('-', left, nullptr);
			break;

		case TK_MulEq:
			exp = new FxMulDiv('*', left, nullptr);
			break;

		case TK_DivEq:
			exp = new FxMulDiv('/', left, nullptr);
			break;

		case TK_ModEq:
			exp = new FxMulDiv('%', left, nullptr);
			break;

		case TK_LShiftEq:
			exp = new FxShift(TK_LShift, left, nullptr);
			break;

		case TK_RShiftEq:
			exp = new FxShift(TK_RShift, left, nullptr);
			break;

		case TK_URShiftEq:
			exp = new FxShift(TK_URShift, left, nullptr);
			break;

		case TK_AndEq:
			exp = new FxBitOp('&', left, nullptr);
			break;

		case TK_XorEq:
			exp = new FxBitOp('^', left, nullptr);
			break;

		case TK_OrEq:
			exp = new FxBitOp('|', left, nullptr);
			break;

		default:
			sc.UnGet();
			delete left;
			return base;
		}

		exp->right = ParseExpressionM(sc, cls);

		FxAssign *ret = new FxAssign(base, exp, true);
		left->Assignment = ret;
		return ret;
	}
}